

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
__thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,size_t depth)

{
  pointer ppuVar1;
  uchar *puVar2;
  iterator iVar3;
  int iVar4;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this_00
  ;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar5;
  long lVar6;
  ushort uVar7;
  ulong uVar8;
  uint uVar9;
  uchar **__args;
  long lVar10;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  uchar *local_230 [64];
  
  this_00 = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
             *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  uVar9 = (uint)((ulong)((long)(bucket->
                               super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(bucket->
                              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0x3f < uVar9) {
    lVar10 = 0;
    uVar8 = 0;
    do {
      ppuVar1 = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        puVar2 = *(uchar **)((long)ppuVar1 + lVar6 * 8 + lVar10);
        local_230[lVar6] = puVar2;
        if (puVar2 == (uchar *)0x0) goto LAB_00212334;
        if (puVar2[depth] == '\0') {
          uVar7 = 0;
        }
        else {
          uVar7 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        auStack_2b0[lVar6] = uVar7;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      __args = local_230;
      lVar6 = 0;
      do {
        pvVar5 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                 ::get_bucket(this_00,(uint)auStack_2b0[lVar6]);
        if (pvVar5 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x78,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                       );
        }
        iVar3._M_current = *(uchar ***)(pvVar5 + 8);
        if (iVar3._M_current == *(uchar ***)(pvVar5 + 0x10)) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(pvVar5,iVar3,__args);
        }
        else {
          *iVar3._M_current = *__args;
          *(long *)(pvVar5 + 8) = *(long *)(pvVar5 + 8) + 8;
        }
        lVar6 = lVar6 + 1;
        __args = __args + 1;
      } while (lVar6 != 0x40);
      uVar8 = uVar8 + 0x40;
      lVar10 = lVar10 + 0x200;
    } while (uVar8 < (uVar9 & 0xffffffc0));
  }
  iVar4 = uVar9 - (uint)uVar8;
  if ((uint)uVar8 <= uVar9 && iVar4 != 0) {
    uVar8 = uVar8 & 0xffffffff;
    do {
      local_230[0] = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start[uVar8];
      if (local_230[0] == (uchar *)0x0) {
LAB_00212334:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (local_230[0][depth] == '\0') {
        uVar9 = 0;
      }
      else {
        uVar9 = (uint)CONCAT11(local_230[0][depth],local_230[0][depth + 1]);
      }
      pvVar5 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
               TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
               ::get_bucket(this_00,uVar9);
      if (pvVar5 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x80,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                     );
      }
      iVar3._M_current = *(uchar ***)(pvVar5 + 8);
      if (iVar3._M_current == *(uchar ***)(pvVar5 + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(pvVar5,iVar3,local_230);
      }
      else {
        *iVar3._M_current = local_230[0];
        *(long *)(pvVar5 + 8) = *(long *)(pvVar5 + 8) + 8;
      }
      uVar8 = uVar8 + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}